

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_init(ion_dictionary_id_t id,ion_dictionary_size_t dictionary_size,
                          ion_key_type_t key_type,ion_key_size_t key_size,
                          ion_value_size_t value_size,int initial_size,int split_threshold,
                          int records_per_bucket,linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  ion_byte_t *piVar2;
  array_list_t *array_list;
  FILE *pFVar3;
  int local_4c;
  int i;
  array_list_t *bucket_map;
  char state_filename [12];
  char data_filename [12];
  ion_err_t err;
  int initial_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_size_t dictionary_size_local;
  ion_dictionary_id_t id_local;
  
  (linear_hash->super).id = id;
  linear_hash->dictionary_size = dictionary_size;
  (linear_hash->super).key_type = key_type;
  (linear_hash->super).record.key_size = key_size;
  (linear_hash->super).record.value_size = value_size;
  linear_hash->initial_size = initial_size;
  linear_hash->num_buckets = initial_size;
  linear_hash->num_records = 0;
  linear_hash->next_split = 0;
  linear_hash->split_threshold = split_threshold;
  linear_hash->records_per_bucket = records_per_bucket;
  linear_hash->record_total_size = (long)(key_size + value_size) + 1;
  piVar2 = (ion_byte_t *)malloc(0x80);
  linear_hash->cache = piVar2;
  dictionary_get_filename((linear_hash->super).id,"lhd",state_filename + 4);
  dictionary_get_filename((linear_hash->super).id,"lhs",(char *)((long)&bucket_map + 3));
  array_list = (array_list_t *)malloc(0x10);
  if (array_list == (array_list_t *)0x0) {
    linear_hash_close(linear_hash);
    dictionary_size_local._3_1_ = '\x06';
  }
  else {
    dictionary_size_local._3_1_ = array_list_init(5,array_list);
    if (dictionary_size_local._3_1_ == '\0') {
      linear_hash->bucket_map = array_list;
      pFVar3 = fopen(state_filename + 4,"r+b");
      linear_hash->database = (FILE *)pFVar3;
      if (linear_hash->database == (FILE *)0x0) {
        pFVar3 = fopen(state_filename + 4,"w+b");
        linear_hash->database = (FILE *)pFVar3;
        if (linear_hash->database == (FILE *)0x0) {
          return '\t';
        }
        for (local_4c = 0; local_4c < linear_hash->initial_size; local_4c = local_4c + 1) {
          iVar1 = write_new_bucket(local_4c,linear_hash);
          if (iVar1 != '\0') {
            linear_hash_close(linear_hash);
            return iVar1;
          }
        }
      }
      pFVar3 = fopen((char *)((long)&bucket_map + 3),"r+b");
      linear_hash->state = (FILE *)pFVar3;
      if (linear_hash->state == (FILE *)0x0) {
        pFVar3 = fopen((char *)((long)&bucket_map + 3),"w+b");
        linear_hash->state = (FILE *)pFVar3;
        if (linear_hash->state == (FILE *)0x0) {
          return '\t';
        }
        dictionary_size_local._3_1_ = linear_hash_write_state(linear_hash);
      }
      else {
        dictionary_size_local._3_1_ = linear_hash_read_state(linear_hash);
      }
      if ((dictionary_size_local._3_1_ == '\0') &&
         (dictionary_size_local._3_1_ = linear_hash_write_state(linear_hash),
         dictionary_size_local._3_1_ == '\0')) {
        dictionary_size_local._3_1_ = '\0';
      }
    }
    else {
      linear_hash_close(linear_hash);
    }
  }
  return dictionary_size_local._3_1_;
}

Assistant:

ion_err_t
linear_hash_init(
	ion_dictionary_id_t		id,
	ion_dictionary_size_t	dictionary_size,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	int						initial_size,
	int						split_threshold,
	int						records_per_bucket,
	linear_hash_table_t		*linear_hash
) {
	/* err */
	ion_err_t err;

	/* parameter not used */
	linear_hash->super.id					= id;
	linear_hash->dictionary_size			= dictionary_size;
	linear_hash->super.key_type				= key_type;
	linear_hash->super.record.key_size		= key_size;
	linear_hash->super.record.value_size	= value_size;

	/* initialize linear_hash fields */
	linear_hash->initial_size				= initial_size;
	linear_hash->num_buckets				= initial_size;
	linear_hash->num_records				= 0;
	linear_hash->next_split					= 0;
	linear_hash->split_threshold			= split_threshold;
	linear_hash->records_per_bucket			= records_per_bucket;
	linear_hash->record_total_size			= key_size + value_size + sizeof(ion_byte_t);
	linear_hash->cache						= malloc(128);

	char data_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhd", data_filename);

	char state_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", state_filename);

	/* mapping of buckets to file offsets */
	array_list_t *bucket_map;

	bucket_map = malloc(sizeof(array_list_t));

	if (NULL == bucket_map) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err_out_of_memory;
	}

	err = array_list_init(5, bucket_map);

	if (err != err_ok) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err;
	}

	linear_hash->bucket_map = bucket_map;
	linear_hash->database	= fopen(data_filename, "r+b");

	if (NULL == linear_hash->database) {
		linear_hash->database = fopen(data_filename, "w+b");

		if (NULL == linear_hash->database) {
			return err_file_open_error;
		}

		int i;

		for (i = 0; i < linear_hash->initial_size; i++) {
			err = write_new_bucket(i, linear_hash);

			if (err != err_ok) {
				linear_hash_close(linear_hash);
				return err;
			}
		}
	}

	linear_hash->state = fopen(state_filename, "r+b");

	if (NULL == linear_hash->state) {
		linear_hash->state = fopen(state_filename, "w+b");

		if (NULL == linear_hash->state) {
			return err_file_open_error;
		}

		err = linear_hash_write_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}
	else {
		err = linear_hash_read_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}

	err = linear_hash_write_state(linear_hash);

	if (err != err_ok) {
		return err;
	}

	/* return pointer to the linear_hash that is sitting in memory */
	return err_ok;
}